

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O0

void __thiscall
Sinclair::ZX8081::ConcreteMachine<false>::set_options
          (ConcreteMachine<false> *this,
          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  pointer pSVar1;
  long local_38;
  Options *options;
  unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str_local;
  ConcreteMachine<false> *this_local;
  
  pSVar1 = std::unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>::get(str);
  if (pSVar1 == (pointer)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(pSVar1,&Reflection::Struct::typeinfo,
                              &ZX8081::Machine::Options::typeinfo,0);
  }
  set_use_automatic_tape_motor_control(this,(bool)(*(byte *)(local_38 + 9) & 1));
  this->allow_fast_tape_hack_ = (bool)(*(byte *)(local_38 + 8) & 1);
  set_use_fast_tape(this);
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) {
			const auto options = dynamic_cast<Options *>(str.get());
			set_use_automatic_tape_motor_control(options->automatic_tape_motor_control);
			allow_fast_tape_hack_ = options->quickload;
			set_use_fast_tape();
		}